

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plane_mixer.c
# Opt level: O0

void calculate_volumes(space_source *source,space_mixer_data *data)

{
  mixed_channel_t mVar1;
  float fVar2;
  float fVar3;
  float local_110;
  byte local_10b;
  byte local_10a;
  byte local_109;
  float local_108;
  mixed_channel_t c_2;
  mixed_channel_t c_1;
  mixed_channel_t c;
  float volume;
  float distance;
  float location [3];
  float roll;
  float max;
  float min;
  float forward [3];
  mixed_channel_t speaker_count;
  mixed_channel_t speakers [33];
  float local_a8 [2];
  float volumes [33];
  space_mixer_data *data_local;
  space_source *source_local;
  
  _max = 0;
  forward[0] = 1.0;
  fVar3 = source->min_distance;
  location[2] = source->max_distance;
  location[1] = source->rolloff;
  volume = source->location[0] - data->location[0];
  distance = source->location[1] - data->location[1];
  location[0] = source->location[2] - data->location[2];
  fVar2 = vec_length(&volume);
  if (location[2] <= fVar2) {
    local_110 = location[2];
  }
  else {
    local_110 = vec_length(&volume);
  }
  local_108 = 1.0;
  if ((fVar3 < local_110) && (fVar3 < location[2])) {
    local_108 = (*data->attenuation)(fVar3,location[2],local_110,location[1]);
    local_108 = local_108 * 1.0;
  }
  if ((source->spatial & 1U) == 0) {
    volume = 0.0;
    distance = 0.0;
    location[0] = 0.0;
    mixed_compute_gains_resolver(&volume,local_a8,forward + 2,(long)forward + 7,&data->vbap);
    for (local_10b = 0; local_10b < forward[1]._3_1_; local_10b = local_10b + 1) {
      if (local_108 * local_a8[local_10b] <= 1.0) {
        fVar3 = local_108 * local_a8[local_10b];
      }
      else {
        fVar3 = 1.0;
      }
      local_a8[local_10b] = fVar3;
    }
  }
  else {
    vec_mul(&volume,data->look_at,&volume);
    if (local_110 < fVar3) {
      if ((1.0 - local_110 / fVar3) * 2.0 <= 1.0) {
        fVar2 = (1.0 - local_110 / fVar3) * 2.0;
      }
      else {
        fVar2 = 1.0;
      }
      vec_lerp(&volume,&volume,&max,fVar2);
    }
    mixed_compute_gains_resolver(&volume,local_a8,forward + 2,(long)forward + 7,&data->vbap);
    for (local_109 = 0; local_109 < forward[1]._3_1_; local_109 = local_109 + 1) {
      if (local_108 * local_a8[local_109] <= 1.0) {
        fVar2 = local_108 * local_a8[local_109];
      }
      else {
        fVar2 = 1.0;
      }
      local_a8[local_109] = fVar2;
    }
    if ((((data->surround & 1U) == 0) && (fVar3 < local_110)) &&
       (fVar3 = calculate_phase(&volume), fVar3 < 0.0)) {
      for (local_10a = 0; local_10a < forward[1]._3_1_; local_10a = local_10a + 1) {
        mVar1 = (data->channels).positions[*(byte *)((long)forward + (ulong)local_10a + 8)];
        if ((((mVar1 == '\x01') || (mVar1 == '\t')) ||
            ((mVar1 == '\x11' || ((mVar1 == '\x19' || (mVar1 == '\x1d')))))) || (mVar1 == ' ')) {
          local_a8[local_10a] = local_a8[local_10a] * -1.0;
        }
      }
    }
  }
  memcpy(source->volumes,local_a8,(ulong)forward[1]._3_1_ << 2);
  memcpy(source->speakers,forward + 2,(ulong)forward[1]._3_1_ << 2);
  source->speaker_count = forward[1]._3_1_;
  return;
}

Assistant:

VECTORIZE static inline void calculate_volumes(float *lvolume, float *rvolume, struct plane_source *source, struct plane_mixer_data *data){
  float min_dist = source->min_distance;
  float max_dist = source->max_distance;
  float roll = source->rolloff;
  float div = data->volume;
  float *src = source->location;
  float *dst = data->location;
  float distance = clamp(min_dist, dist(src, dst), max_dist);
  float volume = div * data->attenuation(min_dist, max_dist, distance, roll);
  float xdiff = src[0]-dst[0];
  float xdist = fabs(xdiff);
  float pan = (xdist <= min_dist)
    ? 0.0
    : copysignf((min(max_dist,xdist)-min_dist)/(max_dist-min_dist), xdiff);
  *lvolume = volume * ((0.0<pan)?(1.0f-pan):1.0f);
  *rvolume = volume * ((pan<0.0)?(1.0f+pan):1.0f);
}